

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

string * disassemble_spirv_amd_abi_cxx11_
                   (string *__return_storage_ptr__,VulkanDevice *device,VkPipeline pipeline,
                   VkShaderStageFlagBits stage)

{
  PFN_vkGetShaderInfoAMD p_Var1;
  size_t __n;
  VkShaderStageFlagBits VVar2;
  VkPipeline pVVar3;
  bool bVar4;
  VkResult VVar5;
  VkDevice pVVar6;
  char *pcVar7;
  allocator<char> local_69;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  undefined4 local_58;
  allocator local_52;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> ret;
  size_t local_30;
  size_t size;
  VkPipeline pVStack_20;
  VkShaderStageFlagBits stage_local;
  VkPipeline pipeline_local;
  VulkanDevice *device_local;
  
  size._4_4_ = stage;
  pVStack_20 = pipeline;
  pipeline_local = (VkPipeline)device;
  device_local = (VulkanDevice *)__return_storage_ptr__;
  bVar4 = Fossilize::VulkanDevice::has_amd_shader_info(device);
  p_Var1 = vkGetShaderInfoAMD;
  if (bVar4) {
    local_30 = 0;
    pVVar6 = Fossilize::VulkanDevice::get_device((VulkanDevice *)pipeline_local);
    VVar5 = (*p_Var1)(pVVar6,pVStack_20,size._4_4_,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,&local_30,
                      (void *)0x0);
    __n = local_30;
    if (VVar5 == VK_SUCCESS) {
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_50,__n,&local_51);
      std::allocator<char>::~allocator(&local_51);
      p_Var1 = vkGetShaderInfoAMD;
      pVVar6 = Fossilize::VulkanDevice::get_device((VulkanDevice *)pipeline_local);
      pVVar3 = pVStack_20;
      VVar2 = size._4_4_;
      pcVar7 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_50);
      VVar5 = (*p_Var1)(pVVar6,pVVar3,VVar2,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,&local_30,pcVar7);
      if (VVar5 == VK_SUCCESS) {
        local_60._M_current =
             (char *)std::begin<std::vector<char,std::allocator<char>>>
                               ((vector<char,_std::allocator<char>_> *)local_50);
        local_68._M_current =
             (char *)std::end<std::vector<char,std::allocator<char>>>
                               ((vector<char,_std::allocator<char>_> *)local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                  ((string *)__return_storage_ptr__,local_60,local_68,&local_69);
        std::allocator<char>::~allocator(&local_69);
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Failed vkGetShaderInfoAMD.\n");
        fflush(_stderr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_52);
        std::allocator<char>::~allocator((allocator<char> *)&local_52);
      }
      local_58 = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_50);
    }
    else {
      fprintf(_stderr,"Fossilize ERROR: Failed vkGetShaderInfoAMD.\n");
      fflush(_stderr);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",
                 (allocator *)
                 &ret.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &ret.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    }
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Does not have vkGetShaderInfoAMD.\n");
    fflush(_stderr);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&size + 3))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&size + 3));
  }
  return __return_storage_ptr__;
}

Assistant:

static string disassemble_spirv_amd(const VulkanDevice &device, VkPipeline pipeline, VkShaderStageFlagBits stage)
{
	if (!device.has_amd_shader_info())
	{
		LOGE("Does not have vkGetShaderInfoAMD.\n");
		return "";
	}

	size_t size = 0;
	if (vkGetShaderInfoAMD(device.get_device(), pipeline, stage, VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD, &size, nullptr) != VK_SUCCESS)
	{
		LOGE("Failed vkGetShaderInfoAMD.\n");
		return "";
	}

	vector<char> ret(size);

	if (vkGetShaderInfoAMD(device.get_device(), pipeline, stage, VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD, &size, ret.data()) != VK_SUCCESS)
	{
		LOGE("Failed vkGetShaderInfoAMD.\n");
		return "";
	}

	return string(begin(ret), end(ret));
}